

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitBuffer.h
# Opt level: O1

bool __thiscall
BitBuffer::read<std::array<unsigned_char,3ul>>(BitBuffer *this,array<unsigned_char,_3UL> *buf)

{
  uint8_t uVar1;
  int iVar2;
  long lVar3;
  
  iVar2 = remaining(this);
  lVar3 = 0;
  do {
    uVar1 = read_byte(this);
    buf->_M_elems[lVar3] = uVar1;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  return 2 < iVar2;
}

Assistant:

bool read(T& buf)
    {
        static_assert(sizeof(buf[0]) == 1, "unit size must be 1 byte");
        bool clean = remaining() >= static_cast<int>(sizeof(buf));

        for (auto& b : buf)
            b = read_byte();

        return clean;
    }